

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

xmlEntityPtr getParameterEntityDebug(void *ctx,xmlChar *name)

{
  xmllintState *lint;
  xmlChar *name_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fprintf(_stdout,"SAX.getParameterEntity(%s)\n",name);
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
getParameterEntityDebug(void *ctx, const xmlChar *name)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return(NULL);
    fprintf(stdout, "SAX.getParameterEntity(%s)\n", name);
    return(NULL);
}